

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParseInNodeContext(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlParserErrors val_00;
  xmlNodePtr val_01;
  char *val_02;
  int local_54;
  int n_listOut;
  xmlNodePtr *listOut;
  int n_options;
  int options;
  int n_datalen;
  int datalen;
  int n_data;
  char *data;
  int n_node;
  xmlNodePtr node;
  xmlParserErrors ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = XML_ERR_OK;
  for (data._4_4_ = 0; (int)data._4_4_ < 3; data._4_4_ = data._4_4_ + 1) {
    for (n_datalen = 0; n_datalen < 4; n_datalen = n_datalen + 1) {
      for (n_options = 0; n_options < 4; n_options = n_options + 1) {
        for (listOut._4_4_ = 0; (int)listOut._4_4_ < 5; listOut._4_4_ = listOut._4_4_ + 1) {
          for (local_54 = 0; local_54 < 1; local_54 = local_54 + 1) {
            iVar1 = xmlMemBlocks();
            val_01 = gen_xmlNodePtr(data._4_4_,0);
            val_02 = gen_const_char_ptr(n_datalen,1);
            iVar2 = gen_int(n_options,2);
            val = gen_parseroptions(listOut._4_4_,3);
            val_00 = xmlParseInNodeContext(val_01,val_02,iVar2,val,0);
            desret_xmlParserErrors(val_00);
            call_tests = call_tests + 1;
            des_xmlNodePtr(data._4_4_,val_01,0);
            des_const_char_ptr(n_datalen,val_02,1);
            des_int(n_options,iVar2,2);
            des_parseroptions(listOut._4_4_,val,3);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlParseInNodeContext",(ulong)(uint)(iVar2 - iVar1)
                    );
              ret_val = ret_val + XML_ERR_INTERNAL_ERROR;
              printf(" %d",(ulong)data._4_4_);
              printf(" %d",(ulong)(uint)n_datalen);
              printf(" %d",(ulong)(uint)n_options);
              printf(" %d",(ulong)listOut._4_4_);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlParseInNodeContext(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserErrors ret_val;
    xmlNodePtr node; /* the context node */
    int n_node;
    const char * data; /* the input string */
    int n_data;
    int datalen; /* the input string length in bytes */
    int n_datalen;
    int options; /* a combination of xmlParserOption */
    int n_options;
    xmlNodePtr * listOut; /* the return value for the set of parsed nodes */
    int n_listOut;

    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_data = 0;n_data < gen_nb_const_char_ptr;n_data++) {
    for (n_datalen = 0;n_datalen < gen_nb_int;n_datalen++) {
    for (n_options = 0;n_options < gen_nb_parseroptions;n_options++) {
    for (n_listOut = 0;n_listOut < gen_nb_xmlNodePtr_ptr;n_listOut++) {
        mem_base = xmlMemBlocks();
        node = gen_xmlNodePtr(n_node, 0);
        data = gen_const_char_ptr(n_data, 1);
        datalen = gen_int(n_datalen, 2);
        options = gen_parseroptions(n_options, 3);
        listOut = gen_xmlNodePtr_ptr(n_listOut, 4);

        ret_val = xmlParseInNodeContext(node, data, datalen, options, listOut);
        desret_xmlParserErrors(ret_val);
        call_tests++;
        des_xmlNodePtr(n_node, node, 0);
        des_const_char_ptr(n_data, data, 1);
        des_int(n_datalen, datalen, 2);
        des_parseroptions(n_options, options, 3);
        des_xmlNodePtr_ptr(n_listOut, listOut, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParseInNodeContext",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_node);
            printf(" %d", n_data);
            printf(" %d", n_datalen);
            printf(" %d", n_options);
            printf(" %d", n_listOut);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}